

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

char * debugline(char *p,char *fmt)

{
  char *pcVar1;
  size_t sVar2;
  stringformatter local_48;
  stringformatter local_40;
  char *local_38;
  char *end;
  char *line;
  char *pcStack_20;
  int num;
  char *fmt_local;
  char *p_local;
  
  p_local = fmt;
  if (sourcestr != (char *)0x0) {
    line._4_4_ = 1;
    end = sourcestr;
    pcStack_20 = fmt;
    fmt_local = p;
    while( true ) {
      local_38 = strchr(end,10);
      pcVar1 = end;
      if (local_38 == (char *)0x0) {
        sVar2 = strlen(end);
        local_38 = pcVar1 + sVar2;
      }
      if ((end <= fmt_local) && (fmt_local <= local_38)) {
        if (sourcefile == (char *)0x0) {
          stringformatter::stringformatter(&local_48,debugline::buf);
          stringformatter::operator()(&local_48,"%d: %s",(ulong)line._4_4_,pcStack_20);
        }
        else {
          stringformatter::stringformatter(&local_40,debugline::buf);
          stringformatter::operator()(&local_40,"%s:%d: %s",sourcefile,(ulong)line._4_4_,pcStack_20)
          ;
        }
        p_local = debugline::buf;
        return p_local;
      }
      if (*local_38 == '\0') break;
      end = local_38 + 1;
      line._4_4_ = line._4_4_ + 1;
    }
    p_local = pcStack_20;
  }
  return p_local;
}

Assistant:

static const char *debugline(const char *p, const char *fmt)
{
    if(!sourcestr) return fmt;
    int num = 1;
    const char *line = sourcestr;
    for(;;)
    {
        const char *end = strchr(line, '\n');
        if(!end) end = line + strlen(line);
        if(p >= line && p <= end)
        {
            static string buf;
            if(sourcefile) formatstring(buf)("%s:%d: %s", sourcefile, num, fmt);
            else formatstring(buf)("%d: %s", num, fmt);
            return buf;
        }
        if(!*end) break;
        line = end + 1;
        num++;
    }
    return fmt;
}